

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O1

void google::protobuf::TestUtilLite::SetPackedExtensions(TestPackedExtensionsLite *message)

{
  int iVar1;
  bool bVar2;
  anon_union_32_1_493b367e_for_TestPackedExtensionsLite_3 *this;
  TestUtilLite local_40 [16];
  
  this = &message->field_0;
  protobuf::internal::ExtensionSet::AddInt32
            (&(this->_impl_)._extensions_,proto2_unittest::packed_int32_extension_lite,'\x05',true,
             0x259,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddInt64
            (&(this->_impl_)._extensions_,proto2_unittest::packed_int64_extension_lite,'\x03',true,
             0x25a,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddUInt32
            (&(this->_impl_)._extensions_,proto2_unittest::packed_uint32_extension_lite,'\r',true,
             0x25b,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddUInt64
            (&(this->_impl_)._extensions_,proto2_unittest::packed_uint64_extension_lite,'\x04',true,
             0x25c,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddInt32
            (&(this->_impl_)._extensions_,proto2_unittest::packed_sint32_extension_lite,'\x11',true,
             0x25d,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddInt64
            (&(this->_impl_)._extensions_,proto2_unittest::packed_sint64_extension_lite,'\x12',true,
             0x25e,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddUInt32
            (&(this->_impl_)._extensions_,proto2_unittest::packed_fixed32_extension_lite,'\a',true,
             0x25f,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddUInt64
            (&(this->_impl_)._extensions_,proto2_unittest::packed_fixed64_extension_lite,'\x06',true
             ,0x260,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddInt32
            (&(this->_impl_)._extensions_,proto2_unittest::packed_sfixed32_extension_lite,'\x0f',
             true,0x261,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddInt64
            (&(this->_impl_)._extensions_,proto2_unittest::packed_sfixed64_extension_lite,'\x10',
             true,0x262,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddFloat
            (&(this->_impl_)._extensions_,proto2_unittest::packed_float_extension_lite,'\x02',true,
             611.0,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddDouble
            (&(this->_impl_)._extensions_,proto2_unittest::packed_double_extension_lite,'\x01',true,
             612.0,(FieldDescriptor *)0x0);
  protobuf::internal::ExtensionSet::AddBool
            (&(this->_impl_)._extensions_,proto2_unittest::packed_bool_extension_lite,'\b',true,true
             ,(FieldDescriptor *)0x0);
  iVar1 = proto2_unittest::packed_enum_extension_lite;
  bVar2 = protobuf::internal::ValidateEnum
                    (5,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_);
  if (bVar2) {
    protobuf::internal::ExtensionSet::AddEnum
              (&(this->_impl_)._extensions_,iVar1,'\x0e',true,5,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddInt32
              (&(this->_impl_)._extensions_,proto2_unittest::packed_int32_extension_lite,'\x05',true
               ,0x2bd,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddInt64
              (&(this->_impl_)._extensions_,proto2_unittest::packed_int64_extension_lite,'\x03',true
               ,0x2be,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddUInt32
              (&(this->_impl_)._extensions_,proto2_unittest::packed_uint32_extension_lite,'\r',true,
               0x2bf,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddUInt64
              (&(this->_impl_)._extensions_,proto2_unittest::packed_uint64_extension_lite,'\x04',
               true,0x2c0,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddInt32
              (&(this->_impl_)._extensions_,proto2_unittest::packed_sint32_extension_lite,'\x11',
               true,0x2c1,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddInt64
              (&(this->_impl_)._extensions_,proto2_unittest::packed_sint64_extension_lite,'\x12',
               true,0x2c2,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddUInt32
              (&(this->_impl_)._extensions_,proto2_unittest::packed_fixed32_extension_lite,'\a',true
               ,0x2c3,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddUInt64
              (&(this->_impl_)._extensions_,proto2_unittest::packed_fixed64_extension_lite,'\x06',
               true,0x2c4,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddInt32
              (&(this->_impl_)._extensions_,proto2_unittest::packed_sfixed32_extension_lite,'\x0f',
               true,0x2c5,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddInt64
              (&(this->_impl_)._extensions_,proto2_unittest::packed_sfixed64_extension_lite,'\x10',
               true,0x2c6,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddFloat
              (&(this->_impl_)._extensions_,proto2_unittest::packed_float_extension_lite,'\x02',true
               ,711.0,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddDouble
              (&(this->_impl_)._extensions_,proto2_unittest::packed_double_extension_lite,'\x01',
               true,712.0,(FieldDescriptor *)0x0);
    protobuf::internal::ExtensionSet::AddBool
              (&(this->_impl_)._extensions_,proto2_unittest::packed_bool_extension_lite,'\b',true,
               false,(FieldDescriptor *)0x0);
    iVar1 = proto2_unittest::packed_enum_extension_lite;
    bVar2 = protobuf::internal::ValidateEnum
                      (6,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_);
    if (bVar2) {
      protobuf::internal::ExtensionSet::AddEnum
                (&(this->_impl_)._extensions_,iVar1,'\x0e',true,6,(FieldDescriptor *)0x0);
      return;
    }
  }
  else {
    SetPackedExtensions(local_40);
  }
  SetPackedExtensions(local_40);
}

Assistant:

void TestUtilLite::SetPackedExtensions(
    unittest::TestPackedExtensionsLite* message) {
  message->AddExtension(unittest::packed_int32_extension_lite, 601);
  message->AddExtension(unittest::packed_int64_extension_lite, 602);
  message->AddExtension(unittest::packed_uint32_extension_lite, 603);
  message->AddExtension(unittest::packed_uint64_extension_lite, 604);
  message->AddExtension(unittest::packed_sint32_extension_lite, 605);
  message->AddExtension(unittest::packed_sint64_extension_lite, 606);
  message->AddExtension(unittest::packed_fixed32_extension_lite, 607);
  message->AddExtension(unittest::packed_fixed64_extension_lite, 608);
  message->AddExtension(unittest::packed_sfixed32_extension_lite, 609);
  message->AddExtension(unittest::packed_sfixed64_extension_lite, 610);
  message->AddExtension(unittest::packed_float_extension_lite, 611);
  message->AddExtension(unittest::packed_double_extension_lite, 612);
  message->AddExtension(unittest::packed_bool_extension_lite, true);
  message->AddExtension(unittest::packed_enum_extension_lite,
                        unittest::FOREIGN_LITE_BAR);
  // add a second one of each field
  message->AddExtension(unittest::packed_int32_extension_lite, 701);
  message->AddExtension(unittest::packed_int64_extension_lite, 702);
  message->AddExtension(unittest::packed_uint32_extension_lite, 703);
  message->AddExtension(unittest::packed_uint64_extension_lite, 704);
  message->AddExtension(unittest::packed_sint32_extension_lite, 705);
  message->AddExtension(unittest::packed_sint64_extension_lite, 706);
  message->AddExtension(unittest::packed_fixed32_extension_lite, 707);
  message->AddExtension(unittest::packed_fixed64_extension_lite, 708);
  message->AddExtension(unittest::packed_sfixed32_extension_lite, 709);
  message->AddExtension(unittest::packed_sfixed64_extension_lite, 710);
  message->AddExtension(unittest::packed_float_extension_lite, 711);
  message->AddExtension(unittest::packed_double_extension_lite, 712);
  message->AddExtension(unittest::packed_bool_extension_lite, false);
  message->AddExtension(unittest::packed_enum_extension_lite,
                        unittest::FOREIGN_LITE_BAZ);
}